

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprCodeMove(Parse *pParse,int iFrom,int iTo,int nReg)

{
  yColCache *pyStack_28;
  int x;
  yColCache *p;
  int i;
  int nReg_local;
  int iTo_local;
  int iFrom_local;
  Parse *pParse_local;
  
  sqlite3VdbeAddOp3(pParse->pVdbe,0xd,iFrom,iTo,nReg + -1);
  pyStack_28 = pParse->aColCache;
  for (p._0_4_ = 0; (int)p < 10; p._0_4_ = (int)p + 1) {
    if ((iFrom <= pyStack_28->iReg) && (pyStack_28->iReg < iFrom + nReg)) {
      pyStack_28->iReg = (iTo - iFrom) + pyStack_28->iReg;
    }
    pyStack_28 = pyStack_28 + 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCodeMove(Parse *pParse, int iFrom, int iTo, int nReg){
  int i;
  struct yColCache *p;
  assert( iFrom>=iTo+nReg || iFrom+nReg<=iTo );
  sqlite3VdbeAddOp3(pParse->pVdbe, OP_Move, iFrom, iTo, nReg-1);
  for(i=0, p=pParse->aColCache; i<SQLITE_N_COLCACHE; i++, p++){
    int x = p->iReg;
    if( x>=iFrom && x<iFrom+nReg ){
      p->iReg += iTo-iFrom;
    }
  }
}